

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

double __thiscall slang::SVInt::toDouble(SVInt *this)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  logic_t lVar4;
  bitwidth_t bVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  double extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  optional<long> oVar14;
  optional<unsigned_long> oVar15;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  char local_3c;
  byte local_3b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  byte local_2b;
  double local_28;
  double dStack_20;
  
  SVInt((SVInt *)&local_48,&this->super_SVIntStorage);
  if (local_3b == 1) {
    flattenUnknowns((SVInt *)&local_48);
  }
  if (local_3c == '\x01') {
    oVar14 = as<long>((SVInt *)&local_48);
    if (((undefined1  [16])
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_28 = (double)oVar14.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_payload;
      dStack_20 = extraout_XMM0_Qb;
      goto LAB_00186ae4;
    }
  }
  else {
    oVar15 = as<unsigned_long>((SVInt *)&local_48);
    if (((undefined1  [16])
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      auVar13._8_4_ =
           oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._4_4_;
      auVar13._0_8_ =
           oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      auVar13._12_4_ = 0x45300000;
      dStack_20 = auVar13._8_8_ - 1.9342813113834067e+25;
      local_28 = dStack_20 +
                 ((double)CONCAT44(0x43300000,
                                   oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload
                                   .super__Optional_payload_base<unsigned_long>._M_payload._0_4_) -
                 4503599627370496.0);
      goto LAB_00186ae4;
    }
  }
  if (local_3c == '\x01') {
    lVar4 = operator[]((SVInt *)&local_48,local_40 - 1);
    bVar3 = false;
    if (((lVar4.value != '\0') && (lVar4.value != '@')) && (bVar3 = false, lVar4.value != 0x80)) {
      operator-((SVInt *)&local_38);
      operator=((SVInt *)&local_48,(SVInt *)&local_38);
      if (((0x40 < local_30) || ((local_2b & 1) != 0)) && ((void *)local_38.val != (void *)0x0)) {
        operator_delete__(local_38.pVal);
      }
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  bVar5 = getActiveBits((SVInt *)&local_48);
  uVar1 = bVar5 - 1;
  uVar10 = uVar1 >> 6;
  uVar8 = 0x40;
  if ((bVar5 & 0x3f) != 0) {
    uVar8 = bVar5 & 0x3f;
  }
  aVar9.pVal = (uint64_t *)&local_48;
  if ((local_3b & 1) != 0) {
    aVar9 = local_48;
  }
  if (0x40 < local_40) {
    aVar9 = local_48;
  }
  uVar6 = aVar9.pVal[uVar10];
  cVar2 = (char)uVar8;
  if (uVar1 < 0x40 || 0x34 < uVar8) {
    if (0x35 < uVar8) {
      uVar11 = ~(-1L << (cVar2 - 0x35U & 0x3f)) & uVar6;
      bVar7 = cVar2 - 0x36;
      uVar6 = uVar6 >> (cVar2 - 0x35U & 0x3f);
      goto LAB_00186a4c;
    }
  }
  else {
    uVar10 = uVar10 - 1;
    bVar7 = cVar2 + 0xbU & 0x3f;
    uVar6 = aVar9.pVal[uVar10] >> bVar7 | uVar6 << 0x40 - bVar7;
    uVar11 = ~(-1L << (cVar2 + 0xbU & 0x3f)) & aVar9.pVal[uVar10];
    bVar7 = cVar2 + 10;
LAB_00186a4c:
    uVar12 = 1L << (bVar7 & 0x3f);
    if (uVar12 < uVar11) {
LAB_00186a5c:
      uVar6 = uVar6 + 1;
    }
    else if (uVar11 == uVar12) {
      if ((uVar6 & 1) != 0) goto LAB_00186a5c;
      if (uVar10 != 0) {
        uVar6 = uVar6 | aVar9.pVal[uVar10 - 1] != 0;
      }
    }
  }
  uVar11 = (ulong)(uVar6 == 0x20000000000000) + (ulong)uVar1;
  if (uVar11 < 0x400) {
    local_28 = (double)((uVar6 & 0xfffffffffffff | uVar11 << 0x34 | (ulong)bVar3 << 0x3f) +
                       0x3ff0000000000000);
    dStack_20 = 0.0;
  }
  else if (bVar3) {
    local_28 = -INFINITY;
    dStack_20 = 0.0;
  }
  else {
    local_28 = INFINITY;
    dStack_20 = 0.0;
  }
LAB_00186ae4:
  if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
     ((undefined1 *)local_48.val != (undefined1 *)0x0)) {
    operator_delete__(local_48.pVal);
  }
  return local_28;
}

Assistant:

double SVInt::toDouble() const {
    return toIEEE754<double, 11, 52, 1023>(*this);
}